

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellUtilityTest.cpp
# Opt level: O0

string * anon_unknown.dwarf_32ed6::quoted(string *__return_storage_ptr__,string *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator local_39;
  undefined1 local_38 [8];
  string quote;
  string *s_local;
  
  quote.field_2._8_8_ = s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"\'",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::operator+(&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,s);
  std::operator+(__return_storage_ptr__,&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string quoted(std::string s) {
#if defined(_WIN32)
  std::string quote = "\"";
#else
  std::string quote = "'";
#endif
  return quote + s + quote;
}